

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadCustomSection
          (BinaryReader *this,Index section_index,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  int iVar3;
  size_type sVar4;
  Enum EVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  size_type __rlen;
  ulong uVar11;
  bool bVar12;
  byte bVar13;
  string_view name;
  uint32_t table_size;
  uint32_t mem_align;
  uint32_t value;
  Index function_index;
  Index local_index;
  uint32_t table_align;
  uint32_t mem_size;
  string_view section_name;
  uint local_b0;
  uint local_ac;
  string_view local_a8;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint32_t local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  ulong local_78;
  uint local_70;
  uint local_6c;
  string_view local_68;
  uint local_4c;
  string_view local_48;
  uint local_34;
  
  local_48._M_len = 0;
  local_48._M_str = (char *)0x0;
  RVar2 = ReadStr(this,&local_48,"section name");
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[7])
                    (this->delegate_,(ulong)section_index,section_size,local_48._M_len,
                     local_48._M_str);
  if (iVar3 != 0) {
    PrintError(this,"BeginCustomSection callback failed");
    return (Result)Error;
  }
  bVar1 = this->reading_custom_section_;
  this->reading_custom_section_ = true;
  if (((this->options_->read_debug_names == true) && (local_48._M_len == 4)) &&
     (iVar3 = bcmp(local_48._M_str,"name",4), iVar3 == 0)) {
    iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa4])(this->delegate_,section_size);
    if (iVar3 == 0) {
      local_7c = 0;
      local_80 = 0;
LAB_00154678:
      if ((this->state_).offset < this->read_end_) {
        RVar2 = ReadU32Leb128(this,&local_ac,"name type");
        if (RVar2.enum_ == Error) {
LAB_001546d9:
          bVar12 = false;
          goto LAB_001546dc;
        }
        if (local_80 != 0) {
          if (local_ac == local_7c) {
            pcVar8 = "duplicate sub-section";
          }
          else {
            if (local_7c <= local_ac) goto LAB_001546ee;
            pcVar8 = "out-of-order sub-section";
          }
          PrintError(this,pcVar8);
          goto LAB_001546d9;
        }
LAB_001546ee:
        local_7c = local_ac;
        RVar2 = ReadU32Leb128(this,(uint32_t *)&local_a8,"subsection size");
        uVar10 = local_ac;
        uVar9 = local_a8._M_len & 0xffffffff;
        if (RVar2.enum_ == Error) {
          bVar12 = false;
          goto LAB_001546dc;
        }
        uVar11 = (this->state_).offset + uVar9;
        uVar7 = this->read_end_;
        if (uVar7 < uVar11) {
          bVar12 = false;
          PrintError(this,"invalid sub-section size: extends past end");
          goto LAB_001546dc;
        }
        this->read_end_ = uVar11;
        if (((int)local_ac < 0xb) &&
           (iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xae])
                              (this->delegate_,(ulong)local_80,(ulong)local_ac,uVar9), iVar3 != 0))
        {
          pcVar8 = "OnNameSubsection callback failed";
          goto LAB_00154778;
        }
        switch(uVar10) {
        case 0:
          iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa5])
                            (this->delegate_,(ulong)local_80,(ulong)local_ac,uVar9);
          if (iVar3 == 0) {
            if (uVar9 != 0) {
              local_a8._M_len = 0;
              local_a8._M_str = (char *)0x0;
              RVar2 = ReadStr(this,&local_a8,"module name");
              if (RVar2.enum_ != Error) {
                iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa6])
                                  (this->delegate_,local_a8._M_len,local_a8._M_str);
                if (iVar3 == 0) goto LAB_00154920;
                PrintError(this,"OnModuleName callback failed");
              }
              goto LAB_001547f9;
            }
            goto LAB_00154920;
          }
          pcVar8 = "OnModuleNameSubsection callback failed";
          break;
        case 1:
          iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa7])
                            (this->delegate_,(ulong)local_80,(ulong)local_ac,uVar9);
          if (iVar3 == 0) {
            if (uVar9 != 0) {
              RVar2 = ReadCount(this,&local_b0,"name count");
              uVar10 = local_b0;
              if (RVar2.enum_ == Error) goto LAB_001547f9;
              local_78 = uVar7;
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa8])();
              if (iVar3 != 0) {
                pcVar8 = "OnFunctionNamesCount callback failed";
                goto LAB_001547ed;
              }
              uVar7 = local_78;
              if (uVar10 != 0) {
                local_94 = 0xffffffff;
                do {
                  local_a8._M_len = 0;
                  local_a8._M_str = (char *)0x0;
                  RVar2 = ReadU32Leb128(this,(uint32_t *)&local_68,"function index");
                  bVar12 = false;
                  if (RVar2.enum_ != Error) {
                    local_90 = (uint)local_68._M_len;
                    if ((uint)local_68._M_len == local_94) {
                      pcVar8 = "duplicate function name: %u";
                    }
                    else {
                      if (local_94 < (uint)local_68._M_len || local_94 == 0xffffffff) {
                        if ((uint)local_68._M_len <
                            this->num_function_signatures_ + this->num_func_imports_) {
                          RVar2 = ReadStr(this,&local_a8,"function name");
                          if (RVar2.enum_ == Error) {
                            bVar12 = false;
                          }
                          else {
                            iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa9])
                                              (this->delegate_,(ulong)local_90,local_a8._M_len,
                                               local_a8._M_str);
                            if (iVar3 == 0) {
                              bVar12 = true;
                            }
                            else {
                              bVar12 = false;
                              PrintError(this,"OnFunctionName callback failed");
                            }
                          }
                        }
                        else {
                          bVar12 = false;
                          PrintError(this,"invalid function index: %u",local_68._M_len & 0xffffffff)
                          ;
                        }
                        local_94 = local_90;
                        goto LAB_00154b87;
                      }
                      pcVar8 = "function index out of order: %u";
                    }
                    bVar12 = false;
                    PrintError(this,pcVar8,local_68._M_len & 0xffffffff);
                  }
LAB_00154b87:
                  if (!bVar12) goto LAB_00154a68;
                  uVar10 = uVar10 - 1;
                  uVar7 = local_78;
                } while (uVar10 != 0);
              }
            }
            goto LAB_00154920;
          }
          pcVar8 = "OnFunctionNameSubsection callback failed";
          break;
        case 2:
          iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xaa])
                            (this->delegate_,(ulong)local_80,(ulong)local_ac,uVar9);
          if (iVar3 == 0) {
            if (uVar9 != 0) {
              RVar2 = ReadCount(this,&local_b0,"function count");
              if (RVar2.enum_ == Error) goto LAB_001547f9;
              local_94 = local_b0;
              local_78 = uVar7;
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xab])();
              if (iVar3 != 0) {
                pcVar8 = "OnLocalNameFunctionCount callback failed";
                goto LAB_001547ed;
              }
              uVar7 = local_78;
              if (local_94 != 0) {
                uVar10 = 0;
                local_84 = 0xffffffff;
                do {
                  RVar2 = ReadU32Leb128(this,(uint32_t *)&local_a8,"function index");
                  bVar12 = false;
                  if (RVar2.enum_ != Error) {
                    local_6c = (uint)local_a8._M_len;
                    if ((uint)local_a8._M_len <
                        this->num_function_signatures_ + this->num_func_imports_) {
                      if (local_84 < (uint)local_a8._M_len || local_84 == 0xffffffff) {
                        RVar2 = ReadCount(this,&local_88,"local count");
                        if (RVar2.enum_ == Error) {
                          bVar12 = false;
                        }
                        else {
                          local_84 = local_88;
                          iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xac])
                                            (this->delegate_,(ulong)local_6c);
                          if (iVar3 == 0) {
                            bVar12 = local_84 == 0;
                            if (!bVar12) {
                              local_70 = 0xffffffff;
                              do {
                                local_84 = local_84 - 1;
                                local_a8._M_len = 0;
                                local_a8._M_str = (char *)0x0;
                                RVar2 = ReadU32Leb128(this,(uint32_t *)&local_68,"named index");
                                bVar12 = false;
                                if (RVar2.enum_ != Error) {
                                  local_8c = (uint)local_68._M_len;
                                  if ((uint)local_68._M_len == local_70) {
                                    pcVar8 = "duplicate local index: %u";
                                  }
                                  else {
                                    if (local_70 < (uint)local_68._M_len || local_70 == 0xffffffff)
                                    {
                                      RVar2 = ReadStr(this,&local_a8,"name");
                                      if (RVar2.enum_ == Error) {
                                        bVar12 = false;
                                      }
                                      else {
                                        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xad])
                                                          (this->delegate_,(ulong)local_6c,
                                                           (ulong)local_8c,local_a8._M_len,
                                                           local_a8._M_str);
                                        if (iVar3 == 0) {
                                          bVar12 = true;
                                        }
                                        else {
                                          bVar12 = false;
                                          PrintError(this,"OnLocalName callback failed");
                                        }
                                      }
                                      local_70 = local_8c;
                                      goto LAB_00154d90;
                                    }
                                    pcVar8 = "local index out of order: %u";
                                  }
                                  bVar12 = false;
                                  PrintError(this,pcVar8,local_68._M_len & 0xffffffff);
                                }
LAB_00154d90:
                              } while ((bVar12) && (local_84 != 0));
                            }
                          }
                          else {
                            bVar12 = false;
                            PrintError(this,"OnLocalNameLocalCount callback failed");
                          }
                        }
                        local_84 = local_6c;
                        goto LAB_00154c83;
                      }
                      pcVar8 = "locals function index out of order: %u";
                    }
                    else {
                      pcVar8 = "invalid function index: %u";
                    }
                    bVar12 = false;
                    PrintError(this,pcVar8,local_a8._M_len & 0xffffffff);
                  }
LAB_00154c83:
                  if (!bVar12) goto LAB_00154a68;
                  uVar10 = uVar10 + 1;
                  uVar7 = local_78;
                } while (uVar10 != local_94);
              }
            }
            goto LAB_00154920;
          }
          pcVar8 = "OnLocalNameSubsection callback failed";
          break;
        default:
switchD_0015479f_caseD_3:
          (this->state_).offset = uVar11;
LAB_00154920:
          local_80 = local_80 + 1;
          bVar12 = true;
          if ((this->state_).offset != uVar11) {
            bVar12 = false;
            PrintError(this,"unfinished sub-section (expected end: 0x%zx)",uVar11);
          }
          goto LAB_00154944;
        case 4:
        case 5:
        case 6:
        case 7:
        case 8:
        case 9:
        case 10:
          if (uVar9 == 0) goto switchD_0015479f_caseD_3;
          RVar2 = ReadCount(this,&local_b0,"name count");
          uVar6 = local_b0;
          if (RVar2.enum_ != Error) {
            local_78 = uVar7;
            iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xaf])
                              (this->delegate_,(ulong)local_b0);
            uVar7 = local_78;
            if (iVar3 == 0) {
              for (; local_78 = uVar7, uVar6 != 0; uVar6 = uVar6 - 1) {
                local_a8._M_len = 0;
                local_a8._M_str = (char *)0x0;
                RVar2 = ReadU32Leb128(this,(uint32_t *)&local_68,"index");
                if (RVar2.enum_ == Error) goto LAB_00154a68;
                local_34 = (uint)local_68._M_len;
                RVar2 = ReadStr(this,&local_a8,"name");
                if (RVar2.enum_ == Error) goto LAB_00154a68;
                iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb0])
                                  (this->delegate_,(ulong)uVar10,(ulong)local_34,local_a8._M_len,
                                   local_a8._M_str);
                if (iVar3 != 0) {
                  PrintError(this,"OnNameEntry callback failed");
                  goto LAB_00154a68;
                }
                uVar7 = local_78;
              }
              goto switchD_0015479f_caseD_3;
            }
            pcVar8 = "OnNameCount callback failed";
LAB_001547ed:
            PrintError(this,pcVar8);
            uVar7 = local_78;
          }
LAB_001547f9:
          bVar12 = false;
          goto LAB_00154944;
        }
LAB_00154778:
        bVar12 = false;
        PrintError(this,pcVar8);
        goto LAB_00154944;
      }
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb1])();
      if (iVar3 == 0) {
        this->did_read_names_section_ = true;
        goto LAB_001541e6;
      }
      pcVar8 = "EndNamesSection callback failed";
      goto LAB_001541fb;
    }
    pcVar8 = "BeginNamesSection callback failed";
    goto LAB_001541fb;
  }
  if (local_48._M_len == 6) {
    iVar3 = bcmp(local_48._M_str,"dylink",6);
    if (iVar3 != 0) goto LAB_00153fea;
    iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb6])(this->delegate_,section_size);
    if (iVar3 != 0) goto LAB_0015417b;
    RVar2 = ReadU32Leb128(this,(uint32_t *)&local_68,"mem_size");
    if ((((RVar2.enum_ != Error) &&
         (RVar2 = ReadU32Leb128(this,&local_ac,"mem_align"), RVar2.enum_ != Error)) &&
        (RVar2 = ReadU32Leb128(this,&local_b0,"table_size"), RVar2.enum_ != Error)) &&
       (RVar2 = ReadU32Leb128(this,&local_88,"table_align"), RVar2.enum_ != Error)) {
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb7])
                        (this->delegate_,local_68._M_len & 0xffffffff,(ulong)local_ac,
                         (ulong)local_b0,(ulong)local_88);
      if (iVar3 != 0) {
        pcVar8 = "OnDylinkInfo callback failed";
        goto LAB_001541fb;
      }
      RVar2 = ReadU32Leb128(this,&local_4c,"needed_dynlibs");
      if (RVar2.enum_ == Error) goto LAB_00154205;
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbc])(this->delegate_,(ulong)local_4c);
      if (iVar3 == 0) {
        bVar12 = local_4c != 0;
        local_4c = local_4c - 1;
        if (bVar12) {
          do {
            local_a8._M_len = 0;
            local_a8._M_str = (char *)0x0;
            RVar2 = ReadStr(this,&local_a8,"dylib so_name");
            if (RVar2.enum_ == Error) goto LAB_00154205;
            iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbd])
                              (this->delegate_,local_a8._M_len,local_a8._M_str);
            if (iVar3 != 0) {
              pcVar8 = "OnDylinkNeeded callback failed";
              goto LAB_001541fb;
            }
            bVar12 = local_4c != 0;
            local_4c = local_4c - 1;
          } while (bVar12);
        }
LAB_00154e73:
        iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbe])();
        if (iVar3 != 0) {
          pcVar8 = "EndDylinkSection callback failed";
          goto LAB_001541fb;
        }
        goto LAB_001541e6;
      }
      pcVar8 = "OnDylinkNeededCount callback failed";
      goto LAB_001541fb;
    }
  }
  else {
    if ((local_48._M_len == 8) && (iVar3 = bcmp(local_48._M_str,"dylink.0",8), iVar3 == 0)) {
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb6])(this->delegate_,section_size);
      if (iVar3 == 0) {
        do {
          if (this->read_end_ <= (this->state_).offset) goto LAB_00154e73;
          RVar2 = ReadU32Leb128(this,&local_ac,"type");
          if (RVar2.enum_ == Error) {
            bVar12 = false;
            goto LAB_00154652;
          }
          RVar2 = ReadU32Leb128(this,(uint32_t *)&local_a8,"subsection size");
          if (RVar2.enum_ == Error) {
            bVar12 = false;
            goto LAB_00154652;
          }
          uVar7 = (this->state_).offset + (local_a8._M_len & 0xffffffff);
          uVar9 = this->read_end_;
          if (uVar9 < uVar7) {
            bVar12 = false;
            PrintError(this,"invalid sub-section size: extends past end");
            goto LAB_00154652;
          }
          this->read_end_ = uVar7;
          switch(local_ac) {
          case 1:
            RVar2 = ReadU32Leb128(this,(uint32_t *)&local_a8,"mem_size");
            if (((RVar2.enum_ != Error) &&
                (RVar2 = ReadU32Leb128(this,(uint32_t *)&local_68,"mem_align"), RVar2.enum_ != Error
                )) && ((RVar2 = ReadU32Leb128(this,&local_b0,"table_size"), RVar2.enum_ != Error &&
                       (RVar2 = ReadU32Leb128(this,&local_88,"table_align"), RVar2.enum_ != Error)))
               ) {
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb7])
                                (this->delegate_,local_a8._M_len & 0xffffffff,
                                 local_68._M_len & 0xffffffff,(ulong)local_b0,(ulong)local_88);
              if (iVar3 == 0) goto LAB_001544b0;
              pcVar8 = "OnDylinkInfo callback failed";
LAB_001544a0:
              PrintError(this,pcVar8);
            }
            break;
          case 2:
            RVar2 = ReadU32Leb128(this,&local_b0,"needed_dynlibs");
            if (RVar2.enum_ == Error) break;
            iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbc])
                              (this->delegate_,(ulong)local_b0);
            if (iVar3 == 0) {
              do {
                bVar12 = local_b0 == 0;
                local_b0 = local_b0 - 1;
                if (bVar12) goto LAB_001544b0;
                local_a8._M_len = 0;
                local_a8._M_str = (char *)0x0;
                RVar2 = ReadStr(this,&local_a8,"dylib so_name");
                if (RVar2.enum_ == Error) goto LAB_0015464c;
                iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbd])
                                  (this->delegate_,local_a8._M_len,local_a8._M_str);
              } while (iVar3 == 0);
              pcVar8 = "OnDylinkNeeded callback failed";
              goto LAB_001544a0;
            }
            pcVar8 = "OnDylinkNeededCount callback failed";
LAB_00154443:
            bVar12 = false;
            PrintError(this,pcVar8);
            goto LAB_0015464f;
          case 3:
            RVar2 = ReadU32Leb128(this,&local_b0,"count");
            if (RVar2.enum_ != Error) {
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb9])
                                (this->delegate_,(ulong)local_b0);
              if (iVar3 != 0) {
                pcVar8 = "OnDylinkExportCount callback failed";
                goto LAB_00154443;
              }
              bVar13 = local_b0 != 0;
              if ((bool)bVar13) {
                uVar10 = 0;
LAB_001544ea:
                local_7c = CONCAT31(local_7c._1_3_,bVar13);
                local_68._M_len = local_68._M_len & 0xffffffff00000000;
                local_a8._M_len = 0;
                local_a8._M_str = (char *)0x0;
                RVar2 = ReadStr(this,&local_a8,"name");
                if ((RVar2.enum_ != Error) &&
                   (RVar2 = ReadU32Leb128(this,(uint32_t *)&local_68,"flags"), RVar2.enum_ != Error)
                   ) {
                  iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbb])
                                    (this->delegate_,local_a8._M_len,local_a8._M_str,
                                     local_68._M_len & 0xffffffff);
                  if (iVar3 == 0) goto code_r0x0015455b;
                  pcVar8 = "OnDylinkExport callback failed";
LAB_00154639:
                  PrintError(this,pcVar8);
                }
LAB_00154640:
                bVar13 = (byte)local_7c;
              }
LAB_00154644:
              if ((bVar13 & 1) == 0) goto LAB_001544b0;
            }
            break;
          case 4:
            RVar2 = ReadU32Leb128(this,&local_b0,"count");
            if (RVar2.enum_ != Error) {
              iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb8])
                                (this->delegate_,(ulong)local_b0);
              if (iVar3 == 0) {
                bVar13 = local_b0 != 0;
                if ((bool)bVar13) {
                  uVar10 = 0;
                  do {
                    local_7c = CONCAT31(local_7c._1_3_,bVar13);
                    local_88 = 0;
                    local_a8._M_len = 0;
                    local_a8._M_str = (char *)0x0;
                    local_68._M_len = 0;
                    local_68._M_str = (char *)0x0;
                    RVar2 = ReadStr(this,&local_a8,"module");
                    if (((RVar2.enum_ == Error) ||
                        (RVar2 = ReadStr(this,&local_68,"field"), RVar2.enum_ == Error)) ||
                       (RVar2 = ReadU32Leb128(this,&local_88,"flags"), RVar2.enum_ == Error))
                    goto LAB_00154640;
                    iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xba])
                                      (this->delegate_,local_a8._M_len,local_a8._M_str,
                                       local_68._M_len,local_68._M_str,(ulong)local_88);
                    if (iVar3 != 0) {
                      pcVar8 = "OnDylinkImport callback failed";
                      goto LAB_00154639;
                    }
                    uVar10 = uVar10 + 1;
                    bVar13 = uVar10 < local_b0;
                  } while ((bool)bVar13);
                }
                goto LAB_00154644;
              }
              pcVar8 = "OnDylinkImportCount callback failed";
              goto LAB_00154443;
            }
            break;
          default:
            (this->state_).offset = uVar7;
LAB_001544b0:
            bVar12 = true;
            if ((this->state_).offset != uVar7) {
              bVar12 = false;
              PrintError(this,"unfinished sub-section (expected end: 0x%zx)",uVar7);
            }
            goto LAB_0015464f;
          }
LAB_0015464c:
          bVar12 = false;
LAB_0015464f:
          this->read_end_ = uVar9;
LAB_00154652:
          EVar5 = Error;
        } while (bVar12);
        goto LAB_0015420e;
      }
LAB_0015417b:
      pcVar8 = "BeginDylinkSection callback failed";
      goto LAB_001541fb;
    }
LAB_00153fea:
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::rfind(&local_48,"reloc",0,5);
    if (sVar4 == 0) {
      RVar2 = ReadRelocSection(this,section_size);
LAB_001541dc:
      EVar5 = Error;
      if (RVar2.enum_ == Error) goto LAB_0015420e;
    }
    else {
      if (local_48._M_len == 7) {
        iVar3 = bcmp(local_48._M_str,"linking",7);
        if (iVar3 != 0) goto LAB_0015405b;
        RVar2 = ReadLinkingSection(this,section_size);
        goto LAB_001541dc;
      }
      if ((local_48._M_len == 0xf) &&
         (iVar3 = bcmp(local_48._M_str,"target_features",0xf), iVar3 == 0)) {
        RVar2 = ReadTargetFeaturesSections(this,section_size);
        goto LAB_001541dc;
      }
LAB_0015405b:
      if (((this->options_->features).code_metadata_enabled_ == true) &&
         (sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            (&local_48,"metadata.code.",0,0xe), sVar4 == 0)) {
        name._M_str = local_48._M_str + 0xe;
        name._M_len = local_48._M_len - 0xe;
        RVar2 = ReadCodeMetadataSection(this,name,section_size);
        goto LAB_001541dc;
      }
      (this->state_).offset = this->read_end_;
    }
LAB_001541e6:
    iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[8])();
    if (iVar3 == 0) {
      EVar5 = Ok;
      goto LAB_0015420e;
    }
    pcVar8 = "EndCustomSection callback failed";
LAB_001541fb:
    PrintError(this,pcVar8);
  }
LAB_00154205:
  EVar5 = Error;
LAB_0015420e:
  this->reading_custom_section_ = bVar1;
  return (Result)EVar5;
LAB_00154a68:
  bVar12 = false;
  uVar7 = local_78;
LAB_00154944:
  this->read_end_ = uVar7;
LAB_001546dc:
  EVar5 = Error;
  if (!bVar12) goto LAB_0015420e;
  goto LAB_00154678;
code_r0x0015455b:
  uVar10 = uVar10 + 1;
  bVar13 = uVar10 < local_b0;
  if (!(bool)bVar13) goto LAB_00154644;
  goto LAB_001544ea;
}

Assistant:

Result BinaryReader::ReadCustomSection(Index section_index,
                                       Offset section_size) {
  std::string_view section_name;
  CHECK_RESULT(ReadStr(&section_name, "section name"));
  CALLBACK(BeginCustomSection, section_index, section_size, section_name);
  ValueRestoreGuard<bool, &BinaryReader::reading_custom_section_> guard(this);
  reading_custom_section_ = true;

  if (options_.read_debug_names && section_name == WABT_BINARY_SECTION_NAME) {
    CHECK_RESULT(ReadNameSection(section_size));
    did_read_names_section_ = true;
  } else if (section_name == WABT_BINARY_SECTION_DYLINK0) {
    CHECK_RESULT(ReadDylink0Section(section_size));
  } else if (section_name == WABT_BINARY_SECTION_DYLINK) {
    CHECK_RESULT(ReadDylinkSection(section_size));
  } else if (section_name.rfind(WABT_BINARY_SECTION_RELOC, 0) == 0) {
    // Reloc sections always begin with "reloc."
    CHECK_RESULT(ReadRelocSection(section_size));
  } else if (section_name == WABT_BINARY_SECTION_TARGET_FEATURES) {
    CHECK_RESULT(ReadTargetFeaturesSections(section_size));
  } else if (section_name == WABT_BINARY_SECTION_LINKING) {
    CHECK_RESULT(ReadLinkingSection(section_size));
  } else if (options_.features.code_metadata_enabled() &&
             section_name.find(WABT_BINARY_SECTION_CODE_METADATA) == 0) {
    std::string_view metadata_name = section_name;
    metadata_name.remove_prefix(sizeof(WABT_BINARY_SECTION_CODE_METADATA) - 1);
    CHECK_RESULT(ReadCodeMetadataSection(metadata_name, section_size));
  } else {
    // This is an unknown custom section, skip it.
    state_.offset = read_end_;
  }
  CALLBACK0(EndCustomSection);
  return Result::Ok;
}